

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum64.c
# Opt level: O3

void Hacl_Bignum64_mod_inv_prime_vartime_precomp
               (Hacl_Bignum_MontArithmetic_bn_mont_ctx_u64 *k,uint64_t *a,uint64_t *res)

{
  uint len;
  uint64_t *n;
  ulong uVar1;
  long lVar2;
  uint64_t *a_00;
  uint64_t mu;
  uint64_t *r2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  undefined8 auStack_70 [3];
  long lStack_58;
  uint64_t *local_50 [2];
  uint64_t local_40;
  uint64_t *local_38;
  
  len = k->len;
  uVar6 = (ulong)len;
  n = k->n;
  local_40 = k->mu;
  local_38 = k->r2;
  uVar5 = uVar6 * 8 + 0xf & 0xfffffffffffffff0;
  lVar2 = -uVar5;
  local_50[0] = res;
  local_50[1] = a;
  *(undefined8 *)((long)auStack_70 + lVar2 + 0x10) = 0x195b3b;
  memset((void *)((long)&lStack_58 + lVar2),0,uVar6 * 8);
  bVar7 = *n < 2;
  *(uint64_t *)((long)&lStack_58 - uVar5) = *n - 2;
  if (1 < uVar6) {
    uVar3 = len - 1;
    if (4 < len) {
      lVar4 = 0;
      do {
        uVar5 = *(ulong *)((long)n + lVar4 + 8);
        *(ulong *)((long)local_50 + lVar4 + lVar2) = uVar5 - bVar7;
        uVar6 = *(ulong *)((long)n + lVar4 + 0x10);
        uVar1 = (ulong)(uVar5 < bVar7);
        *(ulong *)((long)local_50 + lVar4 + lVar2 + 8) = uVar6 - uVar1;
        uVar5 = *(ulong *)((long)n + lVar4 + 0x18);
        uVar1 = (ulong)(uVar6 < uVar1);
        *(ulong *)((long)&local_40 + lVar4 + lVar2) = uVar5 - uVar1;
        uVar6 = *(ulong *)((long)n + lVar4 + 0x20);
        uVar5 = (ulong)(uVar5 < uVar1);
        bVar7 = uVar6 < uVar5;
        *(ulong *)((long)&local_38 + lVar4 + lVar2) = uVar6 - uVar5;
        lVar4 = lVar4 + 0x20;
      } while ((ulong)(uVar3 >> 2) << 5 != lVar4);
    }
    if ((uVar3 & 3) != 0) {
      uVar5 = (ulong)(uVar3 & 0xfffffffc);
      do {
        uVar6 = (ulong)bVar7;
        bVar7 = n[uVar5 + 1] < uVar6;
        *(uint64_t *)((long)local_50 + uVar5 * 8 + lVar2) = n[uVar5 + 1] - uVar6;
        uVar5 = uVar5 + 1;
      } while (uVar5 < uVar3);
    }
  }
  r2 = local_38;
  mu = local_40;
  a_00 = local_50[1];
  *(uint64_t **)((long)auStack_70 + lVar2 + 0x10) = local_50[0];
  *(void **)((long)auStack_70 + lVar2 + 8) = (void *)((long)&lStack_58 + lVar2);
  *(undefined8 *)((long)auStack_70 + lVar2) = 0x195bf9;
  Hacl_Bignum_Exponentiation_bn_mod_exp_vartime_precomp_u64
            (len,n,mu,r2,a_00,len << 6,*(uint64_t **)((long)auStack_70 + lVar2 + 8),
             *(uint64_t **)((long)auStack_70 + lVar2 + 0x10));
  return;
}

Assistant:

void
Hacl_Bignum64_mod_inv_prime_vartime_precomp(
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u64 *k,
  uint64_t *a,
  uint64_t *res
)
{
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u64 k10 = *k;
  uint32_t len1 = k10.len;
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u64 k1 = *k;
  KRML_CHECK_SIZE(sizeof (uint64_t), len1);
  uint64_t n2[len1];
  memset(n2, 0U, len1 * sizeof (uint64_t));
  uint64_t c0 = Lib_IntTypes_Intrinsics_sub_borrow_u64(0ULL, k1.n[0U], 2ULL, n2);
  uint64_t c1;
  if (1U < len1)
  {
    uint64_t *a1 = k1.n + 1U;
    uint64_t *res1 = n2 + 1U;
    uint64_t c = c0;
    for (uint32_t i = 0U; i < (len1 - 1U) / 4U; i++)
    {
      uint64_t t1 = a1[4U * i];
      uint64_t *res_i0 = res1 + 4U * i;
      c = Lib_IntTypes_Intrinsics_sub_borrow_u64(c, t1, 0ULL, res_i0);
      uint64_t t10 = a1[4U * i + 1U];
      uint64_t *res_i1 = res1 + 4U * i + 1U;
      c = Lib_IntTypes_Intrinsics_sub_borrow_u64(c, t10, 0ULL, res_i1);
      uint64_t t11 = a1[4U * i + 2U];
      uint64_t *res_i2 = res1 + 4U * i + 2U;
      c = Lib_IntTypes_Intrinsics_sub_borrow_u64(c, t11, 0ULL, res_i2);
      uint64_t t12 = a1[4U * i + 3U];
      uint64_t *res_i = res1 + 4U * i + 3U;
      c = Lib_IntTypes_Intrinsics_sub_borrow_u64(c, t12, 0ULL, res_i);
    }
    for (uint32_t i = (len1 - 1U) / 4U * 4U; i < len1 - 1U; i++)
    {
      uint64_t t1 = a1[i];
      uint64_t *res_i = res1 + i;
      c = Lib_IntTypes_Intrinsics_sub_borrow_u64(c, t1, 0ULL, res_i);
    }
    uint64_t c10 = c;
    c1 = c10;
  }
  else
  {
    c1 = c0;
  }
  KRML_MAYBE_UNUSED_VAR(c1);
  Hacl_Bignum_Exponentiation_bn_mod_exp_vartime_precomp_u64(len1,
    k1.n,
    k1.mu,
    k1.r2,
    a,
    64U * len1,
    n2,
    res);
}